

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.cpp
# Opt level: O2

void so_5::agent_t::demand_handler_on_message
               (current_thread_id_t working_thread_id,execution_demand_t *d)

{
  atomic_uint *paVar1;
  event_handler_data_t *__x;
  function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)> fStack_38;
  
  if (d->m_limit != (control_block_t *)0x0) {
    LOCK();
    paVar1 = &d->m_limit->m_count;
    (paVar1->super___atomic_base<unsigned_int>)._M_i =
         (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
  }
  __x = (*d->m_receiver->m_handler_finder)(d,"demand_handler_on_message");
  if (__x != (event_handler_data_t *)0x0) {
    std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::
    function(&fStack_38,&__x->m_method);
    process_message(working_thread_id,d,&fStack_38);
    std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  }
  return;
}

Assistant:

void
agent_t::demand_handler_on_message(
	current_thread_id_t working_thread_id,
	execution_demand_t & d )
{
	message_limit::control_block_t::decrement( d.m_limit );

	auto handler = d.m_receiver->m_handler_finder(
			d, "demand_handler_on_message" );
	if( handler )
		process_message( working_thread_id, d, handler->m_method );
}